

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::InstancePrimitive>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::InstancePrimitive>_> *this,PrimRef *prims
          ,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  iterator __position;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  MutexSys *local_68;
  MutexSys *local_60;
  char local_58;
  ThreadLocal2 *local_50;
  ThreadLocal2 *local_48;
  char local_40;
  PrimRef *local_38;
  
  uVar4 = set->_begin;
  uVar5 = set->_end;
  uVar12 = uVar5 - uVar4;
  local_68 = (MutexSys *)(uVar12 * 0x10);
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  this_01 = pTVar6->parent;
  local_38 = prims;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_40 = '\x01';
    local_48 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar13 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_01->alloc0).end = auVar13._0_8_;
    (this_01->alloc0).allocBlockSize = auVar13._8_8_;
    (this_01->alloc0).bytesUsed = auVar13._16_8_;
    (this_01->alloc0).bytesWasted = auVar13._24_8_;
    (this_01->alloc0).ptr = (char *)auVar13._0_8_;
    (this_01->alloc0).cur = auVar13._8_8_;
    (this_01->alloc0).end = auVar13._16_8_;
    (this_01->alloc0).allocBlockSize = auVar13._24_8_;
    auVar13 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = auVar13._0_8_;
      (this_01->alloc1).allocBlockSize = auVar13._8_8_;
      (this_01->alloc1).bytesUsed = auVar13._16_8_;
      (this_01->alloc1).bytesWasted = auVar13._24_8_;
      (this_01->alloc1).ptr = (char *)auVar13._0_8_;
      (this_01->alloc1).cur = auVar13._8_8_;
      (this_01->alloc1).end = auVar13._16_8_;
      (this_01->alloc1).allocBlockSize = auVar13._24_8_;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)auVar13._0_8_;
      (this_01->alloc1).cur = auVar13._8_8_;
      (this_01->alloc1).end = auVar13._16_8_;
      (this_01->alloc1).allocBlockSize = auVar13._24_8_;
      (this_01->alloc1).end = auVar13._0_8_;
      (this_01->alloc1).allocBlockSize = auVar13._8_8_;
      (this_01->alloc1).bytesUsed = auVar13._16_8_;
      (this_01->alloc1).bytesWasted = auVar13._24_8_;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_60 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_58 = '\x01';
    local_50 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_58 == '\x01') {
      MutexSys::unlock(local_60);
    }
    if (local_40 == '\x01') {
      MutexSys::unlock(&local_48->mutex);
    }
  }
  pTVar6->bytesUsed = (long)&local_68->mutex + pTVar6->bytesUsed;
  sVar8 = pTVar6->cur;
  uVar10 = (ulong)(-(int)sVar8 & 0xf);
  uVar11 = (long)&local_68->mutex + uVar10 + sVar8;
  pTVar6->cur = uVar11;
  if (pTVar6->end < uVar11) {
    pTVar6->cur = sVar8;
    if ((MutexSys *)pTVar6->allocBlockSize < (MutexSys *)((long)local_68 << 2)) {
      pcVar7 = (char *)FastAllocator::malloc(this_00,(size_t)&local_68);
    }
    else {
      local_60 = (MutexSys *)pTVar6->allocBlockSize;
      pcVar7 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
      pTVar6->ptr = pcVar7;
      sVar8 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar8;
      pTVar6->cur = 0;
      pTVar6->end = (size_t)local_60;
      pTVar6->cur = (size_t)local_68;
      if (local_60 < local_68) {
        pTVar6->cur = 0;
        local_60 = (MutexSys *)pTVar6->allocBlockSize;
        pcVar7 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
        pTVar6->ptr = pcVar7;
        sVar8 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar8;
        pTVar6->cur = 0;
        pTVar6->end = (size_t)local_60;
        pTVar6->cur = (size_t)local_68;
        if (local_60 < local_68) {
          pTVar6->cur = 0;
          pcVar7 = (char *)0x0;
          goto LAB_0138fe44;
        }
      }
      pTVar6->bytesWasted = sVar8;
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar10;
    pcVar7 = pTVar6->ptr + (uVar11 - (long)local_68);
  }
LAB_0138fe44:
  if (uVar5 != uVar4) {
    lVar9 = 0;
    uVar11 = uVar12;
    do {
      uVar3 = *(uint *)((long)&local_38[uVar4].lower.field_0 + lVar9 * 2 + 0xc);
      *(Geometry **)(pcVar7 + lVar9) =
           (((this->createLeafFunc).bvh)->scene->geometries).items[uVar3].ptr;
      *(uint *)(pcVar7 + lVar9 + 8) = uVar3;
      lVar9 = lVar9 + 0x10;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  uVar11 = 7;
  if (uVar12 < 7) {
    uVar11 = uVar12;
  }
  return (NodeRef)(uVar11 | (ulong)pcVar7 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }